

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::operator==
          (Transfer_Control_Request_PDU *this,Transfer_Control_Request_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Simulation_Management_Header::operator!=
                    (&this->super_Simulation_Management_Header,
                     &Value->super_Simulation_Management_Header);
  if ((((!KVar1) && (this->m_ui32ReqID == Value->m_ui32ReqID)) &&
      (this->m_ui8ReqRelSrv == Value->m_ui8ReqRelSrv)) &&
     (((this->m_ui8TrnTyp == Value->m_ui8TrnTyp &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_TrnsEntID,&Value->m_TrnsEntID),
       !KVar1)) && (this->m_ui32NumRecSets == Value->m_ui32NumRecSets)))) {
    bVar2 = std::operator!=(&this->m_vRecs,&Value->m_vRecs);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Transfer_Control_Request_PDU::operator == ( const Transfer_Control_Request_PDU & Value ) const
{
    if( Simulation_Management_Header::operator !=( Value ) )               return false;
    if( m_ui32ReqID                            != Value.m_ui32ReqID )      return false;
    if( m_ui8ReqRelSrv                         != Value.m_ui8ReqRelSrv )   return false;
    if( m_ui8TrnTyp                            != Value.m_ui8TrnTyp )      return false;
    if( m_TrnsEntID                            != Value.m_TrnsEntID )      return false;
    if( m_ui32NumRecSets                       != Value.m_ui32NumRecSets ) return false;
    if( m_vRecs                                != Value.m_vRecs )          return false;
    return true;
}